

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O0

OutputFile * __thiscall re2c::OutputFile::wdelay_warn_condition_order(OutputFile *this)

{
  value_type this_00;
  reference ppOVar1;
  OutputFragment *this_01;
  OutputFragment *local_18;
  OutputFile *local_10;
  OutputFile *this_local;
  
  local_10 = this;
  ppOVar1 = std::vector<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>::back
                      (&this->blocks);
  this_00 = *ppOVar1;
  this_01 = (OutputFragment *)operator_new(0x188);
  OutputFragment::OutputFragment(this_01,WARN_CONDITION_ORDER,0);
  local_18 = this_01;
  std::vector<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>::push_back
            (&this_00->fragments,&local_18);
  insert_code(this);
  return this;
}

Assistant:

OutputFile & OutputFile::wdelay_warn_condition_order ()
{
	blocks.back ()->fragments.push_back (new OutputFragment (OutputFragment::WARN_CONDITION_ORDER, 0));
	insert_code ();
	return *this;
}